

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::GenerateParsingCode
          (WrapperFieldGenerator *this,Printer *printer,bool use_parse_context)

{
  char *text;
  undefined7 in_register_00000011;
  
  text = 
  "$type_name$ value = _single_$name$_codec.Read(input);\nif ($has_not_property_check$ || value != $default_value$) {\n  $property_name$ = value;\n}\n"
  ;
  if ((int)CONCAT71(in_register_00000011,use_parse_context) != 0) {
    text = 
    "$type_name$ value = _single_$name$_codec.Read(ref input);\nif ($has_not_property_check$ || value != $default_value$) {\n  $property_name$ = value;\n}\n"
    ;
  }
  io::Printer::Print(printer,&(this->super_FieldGeneratorBase).variables_,text);
  return;
}

Assistant:

void WrapperFieldGenerator::GenerateParsingCode(io::Printer* printer, bool use_parse_context) {
  printer->Print(
    variables_,
    use_parse_context
    ? "$type_name$ value = _single_$name$_codec.Read(ref input);\n"
      "if ($has_not_property_check$ || value != $default_value$) {\n"
      "  $property_name$ = value;\n"
      "}\n"
    : "$type_name$ value = _single_$name$_codec.Read(input);\n"
      "if ($has_not_property_check$ || value != $default_value$) {\n"
      "  $property_name$ = value;\n"
      "}\n");
}